

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_get.c
# Opt level: O0

int mpt_config_query(mpt_config *conf,mpt_path *path,mpt_config_handler_t *cb,void *ctx)

{
  int iVar1;
  mpt_metatype *pmVar2;
  mpt_metatype *mt;
  void *ctx_local;
  mpt_config_handler_t *cb_local;
  mpt_path *path_local;
  mpt_config *conf_local;
  
  path_local = (mpt_path *)conf;
  if ((conf == (mpt_config *)0x0) &&
     (((pmVar2 = mpt_config_global((mpt_path *)0x0), pmVar2 == (mpt_metatype *)0x0 ||
       (iVar1 = (*(pmVar2->_vptr->convertable).convert)((mpt_convertable *)pmVar2,0x85,&path_local),
       iVar1 < 0)) || (path_local == (mpt_path *)0x0)))) {
    conf_local._4_4_ = 0;
  }
  else {
    conf_local._4_4_ = (**(code **)path_local->base)(path_local,path,cb,ctx);
  }
  return conf_local._4_4_;
}

Assistant:

extern int mpt_config_query(const MPT_INTERFACE(config) *conf, const MPT_STRUCT(path) *path, MPT_TYPE(config_handler) cb, void *ctx)
{
	if (!conf) {
		MPT_INTERFACE(metatype) *mt;
		
		if (!(mt = mpt_config_global(0))
		 || (MPT_metatype_convert(mt, MPT_ENUM(TypeConfigPtr), &conf) < 0)
		 || !conf) {
			return 0;
		}
	}
	return conf->_vptr->query(conf, path, cb, ctx);
}